

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# items.cpp
# Opt level: O0

void __thiscall CItems::RenderPickup(CItems *this,CNetObj_Pickup *pPrev,CNetObj_Pickup *pCurrent)

{
  long lVar1;
  int iVar2;
  IGraphics *pIVar3;
  IClient *pIVar4;
  vec2 size;
  vector2_base<float> in_RDX;
  vector2_base<float> in_RSI;
  CEffects *in_RDI;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  float fVar7;
  float Offset;
  float Now;
  float Size;
  vec2 Pos;
  int aSprites [8];
  CGameClient *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  float fVar8;
  undefined8 in_stack_ffffffffffffff68;
  float Size_00;
  vector2_base<float> local_58;
  vector2_base<float> local_50;
  vector2_base<float> local_44;
  vector2_base<float> local_3c;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_34;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_30;
  uint local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  vec2 Pos_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pIVar3 = CComponent::Graphics((CComponent *)0x16d25a);
  local_2c = g_pData->m_aImages[1].m_Id.m_Id;
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x13])(pIVar3,(ulong)local_2c);
  pIVar3 = CComponent::Graphics((CComponent *)0x16d28c);
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x17])();
  vector2_base<float>::vector2_base
            (&local_3c,(float)*(int *)in_RSI,(float)*(int *)((long)in_RSI + 4));
  vector2_base<float>::vector2_base
            (&local_44,(float)*(int *)in_RDX,(float)*(int *)((long)in_RDX + 4));
  pIVar4 = CComponent::Client((CComponent *)0x16d2d5);
  IClient::IntraGameTick(pIVar4);
  _local_34 = mix<vector2_base<float>,float>(in_RSI,in_RDX,(float)((ulong)in_RDI >> 0x20));
  Pos_00.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x3b;
  Pos_00.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x3c;
  local_28 = 0x3800000037;
  uStack_20 = 0x3a00000039;
  CComponent::RenderTools((CComponent *)0x16d327);
  CRenderTools::SelectSprite
            ((CRenderTools *)in_RDI,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (int)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
  Size_00 = (float)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  size.field_1.y = 0.0;
  size.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)(*(int *)((long)in_RDX + 8) - 2)
  ;
  switch(size) {
  case (vec2)0x0:
    break;
  case (vec2)0x1:
    break;
  case (vec2)0x2:
    break;
  case (vec2)0x3:
    Size_00 = (float)((ulong)((in_RDI->super_CComponent).m_pClient)->m_pEffects >> 0x20);
    local_50 = _local_34;
    vector2_base<float>::vector2_base(&local_58,96.0,18.0);
    CEffects::PowerupShine(in_RDI,Pos_00,size);
    local_34.x = local_34.x - 10.0;
    break;
  case (vec2)0x4:
    break;
  case (vec2)0x5:
  }
  pIVar4 = CComponent::Client((CComponent *)0x16d4a9);
  fVar5 = IClient::LocalTime(pIVar4);
  if ((RenderPickup(CNetObj_Pickup_const*,CNetObj_Pickup_const*)::s_LastLocalTime == '\0') &&
     (iVar2 = __cxa_guard_acquire(&RenderPickup(CNetObj_Pickup_const*,CNetObj_Pickup_const*)::
                                   s_LastLocalTime), iVar2 != 0)) {
    RenderPickup::s_LastLocalTime = fVar5;
    __cxa_guard_release(&RenderPickup(CNetObj_Pickup_const*,CNetObj_Pickup_const*)::s_LastLocalTime)
    ;
  }
  fVar6 = fVar5 - RenderPickup::s_LastLocalTime;
  fVar7 = CGameClient::GetAnimationPlaybackSpeed(in_stack_ffffffffffffff58);
  RenderPickup::s_Time = fVar6 * fVar7 + RenderPickup::s_Time;
  fVar6 = aStack_30.y * 0.03125 + local_34.x * 0.03125;
  fVar7 = cosf(RenderPickup::s_Time + RenderPickup::s_Time + fVar6);
  fVar8 = 2.5;
  local_34.x = fVar7 * 2.5 + local_34.x;
  fVar6 = sinf(RenderPickup::s_Time + RenderPickup::s_Time + fVar6);
  _local_34 = (vector2_base<float>)CONCAT44(fVar6 * fVar8 + aStack_30.y,local_34);
  RenderPickup::s_LastLocalTime = fVar5;
  pIVar3 = CComponent::Graphics((CComponent *)0x16d5e2);
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])(0);
  CComponent::RenderTools((CComponent *)0x16d5fe);
  CRenderTools::DrawSprite
            ((CRenderTools *)size,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),Size_00);
  pIVar3 = CComponent::Graphics((CComponent *)0x16d622);
  (*(pIVar3->super_IInterface)._vptr_IInterface[0x18])();
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CItems::RenderPickup(const CNetObj_Pickup *pPrev, const CNetObj_Pickup *pCurrent)
{
	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_GAME].m_Id);
	Graphics()->QuadsBegin();
	vec2 Pos = mix(vec2(pPrev->m_X, pPrev->m_Y), vec2(pCurrent->m_X, pCurrent->m_Y), Client()->IntraGameTick());
	float Size = 64.0f;
	const int aSprites[] = {
		SPRITE_PICKUP_HEALTH,
		SPRITE_PICKUP_ARMOR,
		SPRITE_PICKUP_GRENADE,
		SPRITE_PICKUP_SHOTGUN,
		SPRITE_PICKUP_LASER,
		SPRITE_PICKUP_NINJA,
		SPRITE_PICKUP_GUN,
		SPRITE_PICKUP_HAMMER
	};
	RenderTools()->SelectSprite(aSprites[pCurrent->m_Type]);

	switch(pCurrent->m_Type)
	{
	case PICKUP_GRENADE:
		Size = g_pData->m_Weapons.m_aId[WEAPON_GRENADE].m_VisualSize;
		break;
	case PICKUP_SHOTGUN:
		Size = g_pData->m_Weapons.m_aId[WEAPON_SHOTGUN].m_VisualSize;
		break;
	case PICKUP_LASER:
		Size = g_pData->m_Weapons.m_aId[WEAPON_LASER].m_VisualSize;
		break;
	case PICKUP_NINJA:
		m_pClient->m_pEffects->PowerupShine(Pos, vec2(96,18));
		Size *= 2.0f;
		Pos.x -= 10.0f;
		break;
	case PICKUP_GUN:
		Size = g_pData->m_Weapons.m_aId[WEAPON_GUN].m_VisualSize;
		break;
	case PICKUP_HAMMER:
		Size = g_pData->m_Weapons.m_aId[WEAPON_HAMMER].m_VisualSize;
		break;
	}

	const float Now = Client()->LocalTime();
	static float s_Time = 0.0f;
	static float s_LastLocalTime = Now;
	s_Time += (Now - s_LastLocalTime) * m_pClient->GetAnimationPlaybackSpeed();
	const float Offset = Pos.y/32.0f + Pos.x/32.0f;
	Pos.x += cosf(s_Time*2.0f+Offset)*2.5f;
	Pos.y += sinf(s_Time*2.0f+Offset)*2.5f;
	s_LastLocalTime = Now;

	Graphics()->QuadsSetRotation(0.0f);
	RenderTools()->DrawSprite(Pos.x, Pos.y, Size);
	Graphics()->QuadsEnd();
}